

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_cpy(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *tensor;
  
  if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] - b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3] == 0) {
    tensor = ggml_view_tensor(ctx,b);
    if (b->name[0] == '\0') {
      ggml_format_name(tensor,"%s (copy)",a->name);
    }
    else {
      ggml_format_name(tensor,"%s (copy of %s)",b->name);
    }
    tensor->op = GGML_OP_CPY;
    tensor->src[0] = a;
    tensor->src[1] = b;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0xb8c,"GGML_ASSERT(%s) failed","ggml_nelements(a) == ggml_nelements(b)");
}

Assistant:

struct ggml_tensor * ggml_cpy(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    return ggml_cpy_impl(ctx, a, b);
}